

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDynamicLoader.cxx
# Opt level: O1

LibraryHandle cmDynamicLoader::OpenLibrary(char *libname)

{
  bool bVar1;
  cmDynamicLoaderCache *pcVar2;
  LibraryHandle lh;
  allocator local_39;
  LibraryHandle local_38;
  string local_30;
  
  pcVar2 = cmDynamicLoaderCache::GetInstance();
  bVar1 = cmDynamicLoaderCache::GetCacheFile(pcVar2,libname,&local_38);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_30,libname,&local_39);
    local_38 = cmsys::DynamicLoader::OpenLibrary(&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = cmDynamicLoaderCache::GetInstance();
    cmDynamicLoaderCache::CacheFile(pcVar2,libname,&local_38);
  }
  return local_38;
}

Assistant:

cmsys::DynamicLoader::LibraryHandle cmDynamicLoader::OpenLibrary(
  const char* libname )
{
  cmsys::DynamicLoader::LibraryHandle lh;
  if ( cmDynamicLoaderCache::GetInstance()->GetCacheFile(libname, lh) )
    {
    return lh;
    }
  lh = cmsys::DynamicLoader::OpenLibrary(libname);
  cmDynamicLoaderCache::GetInstance()->CacheFile(libname, lh);
  return lh;
}